

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O0

iterator * __thiscall
google::
sparse_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
::insert_at(sparse_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
            *this,const_reference obj,size_type pos)

{
  st_iterator it;
  st_iterator it_end;
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  length_error *this_00;
  long in_RSI;
  iterator *in_RDI;
  sparse_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *in_stack_ffffffffffffff30;
  size_type in_stack_ffffffffffffff38;
  sparse_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *in_stack_ffffffffffffff40;
  size_type in_stack_ffffffffffffff48;
  sparsetable<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *in_stack_ffffffffffffff50;
  size_type in_stack_ffffffffffffff68;
  sparsetable<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *in_stack_ffffffffffffff70;
  iterator *piVar4;
  undefined8 local_68;
  undefined8 local_60;
  nonempty_iterator local_58;
  undefined8 local_50;
  sparse_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *local_48;
  sparse_hashtable_iterator<std::pair<const_int,_int>,_const_int,_Hasher,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *local_40;
  undefined8 local_30;
  
  piVar4 = in_RDI;
  sVar2 = size(in_stack_ffffffffffffff30);
  sVar3 = max_size((sparse_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                    *)0x1010cea);
  if (sVar2 < sVar3) {
    bVar1 = test_deleted(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    if (bVar1) {
      *(long *)(in_RSI + 0x40) = *(long *)(in_RSI + 0x40) + -1;
    }
    sparsetable<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
    ::set(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
          (const_reference)in_stack_ffffffffffffff40);
    sparsetable<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
    ::get_iter(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    sparsetable<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
    ::nonempty_end(in_stack_ffffffffffffff50);
    it.row_end._M_current =
         (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
          *)local_68;
    it.row_begin._M_current =
         (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
          *)local_30;
    it.row_current._M_current =
         (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
          *)local_60;
    it.col_current = local_58;
    it_end.row_end._M_current =
         (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
          *)in_stack_ffffffffffffff68;
    it_end.row_begin._M_current =
         (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
          *)local_50;
    it_end.row_current._M_current =
         (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
          *)in_stack_ffffffffffffff70;
    it_end.col_current = (nonempty_iterator)piVar4;
    sparse_hashtable_iterator<std::pair<const_int,_int>,_const_int,_Hasher,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
    ::sparse_hashtable_iterator(local_40,local_48,it,it_end);
    return in_RDI;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error(this_00,"insert overflow");
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

iterator insert_at(const_reference obj, size_type pos) {
    if (size() >= max_size()) {
      throw std::length_error("insert overflow");
    }
    if (test_deleted(pos)) {  // just replace if it's been deleted
      // The set() below will undelete this object.  We just worry about
      // stats
      assert(num_deleted > 0);
      --num_deleted;  // used to be, now it isn't
    }
    table.set(pos, obj);
    return iterator(this, table.get_iter(pos), table.nonempty_end());
  }